

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBoxPrivateContainer::updateStyleSettings(QComboBoxPrivateContainer *this)

{
  long lVar1;
  QWidget *this_00;
  int iVar2;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  bool enable;
  QStyleOptionComboBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&opt,0xaa,0x90);
  comboStyleOption(&opt,this);
  this_00 = (QWidget *)this->view;
  pQVar3 = QWidget::style(&this->combo->super_QWidget);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x13,&opt,this->combo,0);
  enable = true;
  if (iVar2 == 0) {
    pQVar3 = QWidget::style(&this->combo->super_QWidget);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x19,&opt,this->combo,0);
    enable = iVar2 != 0;
  }
  QWidget::setMouseTracking(this_00,enable);
  pQVar3 = QWidget::style(&this->combo->super_QWidget);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x45,&opt,this->combo,0);
  QFrame::setFrameStyle(&this->super_QFrame,iVar2);
  updateTopBottomMargin(this);
  QStyleOptionComboBox::~QStyleOptionComboBox(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::updateStyleSettings()
{
    // add scroller arrows if style needs them
    QStyleOptionComboBox opt = comboStyleOption();
    view->setMouseTracking(combo->style()->styleHint(QStyle::SH_ComboBox_ListMouseTracking, &opt, combo) ||
                           combo->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, combo));
    setFrameStyle(combo->style()->styleHint(QStyle::SH_ComboBox_PopupFrameStyle, &opt, combo));
    updateTopBottomMargin();
}